

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegenTest.cpp
# Opt level: O0

void __thiscall
TestRegenerateCmakeAddSubdirectory_NoSubDirs::Run
          (TestRegenerateCmakeAddSubdirectory_NoSubDirs *this)

{
  byte bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  runtime_error *this_00;
  __type v;
  ostringstream oss;
  string expectedOutput;
  Component comp;
  TemporaryWorkingDirectory workdir;
  undefined7 in_stack_fffffffffffffb20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb40;
  path *in_stack_fffffffffffffb48;
  path *in_stack_fffffffffffffb50;
  ostringstream local_498 [48];
  path *in_stack_fffffffffffffb98;
  Component *in_stack_fffffffffffffba0;
  char *in_stack_fffffffffffffbd8;
  TemporaryWorkingDirectory *in_stack_fffffffffffffbe0;
  Component *in_stack_fffffffffffffc58;
  ostream *in_stack_fffffffffffffc60;
  allocator local_319;
  string local_318 [720];
  TemporaryWorkingDirectory local_48;
  
  TemporaryWorkingDirectory::TemporaryWorkingDirectory
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  __rhs = &TemporaryWorkingDirectory::operator()(&local_48)->m_pathname;
  boost::filesystem::path::path(in_stack_fffffffffffffb50,(value_type *)in_stack_fffffffffffffb48);
  boost::filesystem::operator/(in_stack_fffffffffffffb48,(path *)in_stack_fffffffffffffb40);
  boost::filesystem::create_directories((path *)0x1590ad);
  boost::filesystem::path::~path((path *)0x1590bc);
  boost::filesystem::path::~path((path *)0x1590c9);
  boost::filesystem::path::path(in_stack_fffffffffffffb50,(value_type *)in_stack_fffffffffffffb48);
  Component::Component(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  boost::filesystem::path::~path((path *)0x159103);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_318,"",&local_319);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  std::__cxx11::ostringstream::ostringstream(local_498);
  RegenerateCmakeAddSubdirectory(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  std::__cxx11::ostringstream::str();
  bVar1 = std::operator==(in_stack_fffffffffffffb40,__rhs);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb40);
  if ((bVar1 & 1) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed: oss.str() == expectedOutput");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::~ostringstream(local_498);
  std::__cxx11::string::~string(local_318);
  Component::~Component((Component *)CONCAT17(bVar1,in_stack_fffffffffffffb20));
  TemporaryWorkingDirectory::~TemporaryWorkingDirectory
            ((TemporaryWorkingDirectory *)CONCAT17(bVar1,in_stack_fffffffffffffb20));
  return;
}

Assistant:

TEST(RegenerateCmakeAddSubdirectory_NoSubDirs) {
  TemporaryWorkingDirectory workdir(name);
  filesystem::create_directories(workdir() / "MyComponent");

  Component comp("./MyComponent/");

  const std::string expectedOutput("");

  std::ostringstream oss;
  RegenerateCmakeAddSubdirectory(oss, comp);

  ASSERT(oss.str() == expectedOutput);
}